

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ResultValueBase<Catch::clara::detail::ParseState> * __thiscall
Catch::clara::detail::ResultValueBase<Catch::clara::detail::ParseState>::operator=
          (ResultValueBase<Catch::clara::detail::ParseState> *this,
          ResultValueBase<Catch::clara::detail::ParseState> *other)

{
  Type TVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  
  if ((this->super_ResultBase).m_type == Ok) {
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
              (&(this->field_0).m_value.m_remainingTokens.m_tokenBuffer);
  }
  TVar1 = (other->super_ResultBase).m_type;
  (this->super_ResultBase).m_type = TVar1;
  if (TVar1 == Ok) {
    (this->field_0).m_value.m_type = (other->field_0).m_value.m_type;
    pbVar2 = (other->field_0).m_value.m_remainingTokens.itEnd._M_current;
    (this->field_0).m_value.m_remainingTokens.it._M_current =
         (other->field_0).m_value.m_remainingTokens.it._M_current;
    (this->field_0).m_value.m_remainingTokens.itEnd._M_current = pbVar2;
    std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::vector
              (&(this->field_0).m_value.m_remainingTokens.m_tokenBuffer,
               &(other->field_0).m_value.m_remainingTokens.m_tokenBuffer);
  }
  return this;
}

Assistant:

auto operator=(ResultValueBase const &other) -> ResultValueBase & {
          if (m_type == ResultBase::Ok)
            m_value.~T();
          ResultBase::operator=(other);
          if (m_type == ResultBase::Ok)
            new (&m_value) T(other.m_value);
          return *this;
        }